

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_HRR_Writer::WriteHRR_Ket_External_(OSTEI_HRR_Writer *this,ostream *os,QAM *am)

{
  _Type aiVar1;
  undefined8 uVar2;
  OSTEI_HRR_Algorithm_Base *pOVar3;
  RRStepType step;
  int iVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  int local_1d8;
  int iStack_1d4;
  _Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_> local_1b8;
  char *local_188;
  size_type local_180;
  char local_178 [8];
  undefined8 uStack_170;
  char *local_168;
  size_type local_160;
  char local_158;
  undefined7 uStack_157;
  undefined8 uStack_150;
  char *local_148;
  size_type local_140;
  char local_138 [8];
  undefined8 uStack_130;
  char *local_128;
  size_type local_120;
  char local_118 [8];
  undefined8 uStack_110;
  undefined1 local_108 [16];
  _Alloc_hider local_f8;
  size_type local_f0;
  char local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  size_type local_b8;
  char local_b0 [16];
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  size_type local_90;
  char local_88 [16];
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  size_type local_68;
  char local_60 [16];
  string local_50;
  
  pOVar3 = this->hrr_algo_;
  aiVar1 = *(_Type *)((am->qam)._M_elems + 2);
  std::__cxx11::string::string((string *)&local_128,"",(allocator *)&local_1b8);
  local_70._M_p = local_60;
  if (local_128 == local_118) {
    local_60[8] = (undefined1)uStack_110;
    local_60[9] = uStack_110._1_1_;
    local_60[10] = uStack_110._2_1_;
    local_60[0xb] = uStack_110._3_1_;
    local_60[0xc] = uStack_110._4_1_;
    local_60[0xd] = uStack_110._5_1_;
    local_60[0xe] = uStack_110._6_1_;
    local_60[0xf] = uStack_110._7_1_;
  }
  else {
    local_70._M_p = local_128;
  }
  local_68 = local_120;
  local_120 = 0;
  local_118[0] = '\0';
  local_128 = local_118;
  local_78 = (undefined1  [8])aiVar1;
  step = OSTEI_HRR_Algorithm_Base::GetKetRRStep(pOVar3,(DAM *)local_78);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_128);
  poVar5 = std::operator<<(os,(string *)&indent4_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"HRR_");
  RRStepTypeToStr_abi_cxx11_((string *)&local_1b8,step);
  poVar5 = std::operator<<(poVar5,(string *)&local_1b8);
  poVar5 = std::operator<<(poVar5,"_");
  poVar5 = std::operator<<(poVar5,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(am->qam)._M_elems[2]]);
  poVar5 = std::operator<<(poVar5,"_");
  poVar5 = std::operator<<(poVar5,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(am->qam)._M_elems[3]]);
  std::operator<<(poVar5,"(\n");
  std::__cxx11::string::~string((string *)&local_1b8);
  poVar5 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"");
  HRRVarName_abi_cxx11_((string *)&local_1b8,am);
  poVar5 = std::operator<<(poVar5,(string *)&local_1b8);
  std::operator<<(poVar5,",\n");
  std::__cxx11::string::~string((string *)&local_1b8);
  pOVar3 = this->hrr_algo_;
  aiVar1 = *(_Type *)((am->qam)._M_elems + 2);
  std::__cxx11::string::string((string *)&local_148,"",(allocator *)local_108);
  local_98._M_p = local_88;
  if (local_148 == local_138) {
    local_88[8] = (undefined1)uStack_130;
    local_88[9] = uStack_130._1_1_;
    local_88[10] = uStack_130._2_1_;
    local_88[0xb] = uStack_130._3_1_;
    local_88[0xc] = uStack_130._4_1_;
    local_88[0xd] = uStack_130._5_1_;
    local_88[0xe] = uStack_130._6_1_;
    local_88[0xf] = uStack_130._7_1_;
  }
  else {
    local_98._M_p = local_148;
  }
  local_90 = local_140;
  local_140 = 0;
  local_138[0] = '\0';
  local_148 = local_138;
  local_a0 = (undefined1  [8])aiVar1;
  OSTEI_HRR_Algorithm_Base::GetKetAMReq((DAMSet *)&local_1b8,pOVar3,(DAM *)local_a0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_148);
  for (p_Var6 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &local_1b8._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    poVar5 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
    poVar5 = std::operator<<(poVar5,"");
    uVar2 = *(undefined8 *)(am->qam)._M_elems;
    local_d8 = *(undefined8 *)(p_Var6 + 1);
    uStack_d0 = 0;
    std::__cxx11::string::string((string *)&local_168,(string *)&am->tag);
    local_1d8 = (int)uVar2;
    iStack_1d4 = (int)((ulong)uVar2 >> 0x20);
    local_108._8_4_ = (undefined4)local_d8;
    local_108._12_4_ = (undefined4)((ulong)local_d8 >> 0x20);
    local_108._0_4_ = local_1d8;
    local_108._4_4_ = iStack_1d4;
    local_f8._M_p = &local_e8;
    if (local_168 == &local_158) {
      uStack_e0 = uStack_150;
    }
    else {
      local_f8._M_p = local_168;
    }
    uStack_e7 = uStack_157;
    local_e8 = local_158;
    local_f0 = local_160;
    local_160 = 0;
    local_158 = '\0';
    local_168 = &local_158;
    HRRVarName_abi_cxx11_(&local_50,(QAM *)local_108);
    poVar5 = std::operator<<(poVar5,(string *)&local_50);
    std::operator<<(poVar5,",\n");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_168);
  }
  std::_Rb_tree<DAM,_DAM,_std::_Identity<DAM>,_std::less<DAM>,_std::allocator<DAM>_>::~_Rb_tree
            (&local_1b8);
  poVar5 = std::operator<<(os,(string *)&indent5_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"hCD, ");
  aiVar1 = *(_Type *)(am->qam)._M_elems;
  std::__cxx11::string::string((string *)&local_188,"",(allocator *)&local_1b8);
  local_c0._M_p = local_b0;
  if (local_188 == local_178) {
    local_b0[8] = (undefined1)uStack_170;
    local_b0[9] = uStack_170._1_1_;
    local_b0[10] = uStack_170._2_1_;
    local_b0[0xb] = uStack_170._3_1_;
    local_b0[0xc] = uStack_170._4_1_;
    local_b0[0xd] = uStack_170._5_1_;
    local_b0[0xe] = uStack_170._6_1_;
    local_b0[0xf] = uStack_170._7_1_;
  }
  else {
    local_c0._M_p = local_188;
  }
  local_b8 = local_180;
  local_180 = 0;
  local_178[0] = '\0';
  local_188 = local_178;
  local_c8 = (undefined1  [8])aiVar1;
  iVar4 = NCART((DAM *)local_c8);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,iVar4);
  std::operator<<(poVar5,");\n");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_188);
  poVar5 = std::operator<<((ostream *)&std::cout,"SIMINT EXTERNAL HRR ");
  RRStepTypeToStr_abi_cxx11_((string *)&local_1b8,step);
  poVar5 = std::operator<<(poVar5,(string *)&local_1b8);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[2]);
  poVar5 = std::operator<<(poVar5," ");
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,(am->qam)._M_elems[3]);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

void OSTEI_HRR_Writer::WriteHRR_Ket_External_(std::ostream & os, QAM am) const
{
    RRStepType rrstep = hrr_algo_.GetKetRRStep({am[2], am[3]});
    os << indent4 << "HRR_" << RRStepTypeToStr(rrstep) << "_"
       << amchar[am[2]] << "_" << amchar[am[3]] << "(\n";

    // pointer to result buffer
    os << indent5 << "" << HRRVarName(am) << ",\n";

    // pointer to requirements
    for(const auto & it : hrr_algo_.GetKetAMReq({am[2], am[3]}))
        os << indent5 << "" << HRRVarName({am[0], am[1], it[0], it[1], am.tag}) << ",\n";

    os << indent5 << "hCD, " << NCART(DAM{am[0], am[1]}) << ");\n";

    // Mark this as required in the log file
    std::cout << "SIMINT EXTERNAL HRR " << RRStepTypeToStr(rrstep)
              << " " << am[2] << " " << am[3] << "\n";
}